

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_create_any(lysc_node *schema,void *value,LYD_ANYDATA_VALUETYPE value_type,
                     ly_bool use_value,lyd_node **node)

{
  char cVar1;
  ushort uVar2;
  LYD_ANYDATA_VALUETYPE LVar3;
  LY_ERR LVar4;
  lyd_node *trg;
  ly_in *in;
  lyd_node *tree;
  lyd_any_value any_val;
  ly_in *local_50;
  lyd_node *local_48;
  lyd_node **local_40;
  lyd_any_value local_38;
  
  local_50 = (ly_in *)0x0;
  uVar2 = schema->nodetype;
  local_40 = node;
  if ((uVar2 & 0x60) == 0) {
    __assert_fail("schema->nodetype & LYD_NODE_ANY",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                  ,0x140,
                  "LY_ERR lyd_create_any(const struct lysc_node *, const void *, LYD_ANYDATA_VALUETYPE, ly_bool, struct lyd_node **)"
                 );
  }
  trg = (lyd_node *)calloc(1,0x48);
  if (trg == (lyd_node *)0x0) {
    ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_create_any")
    ;
    return LY_EMEM;
  }
  trg->schema = schema;
  trg->prev = trg;
  trg->flags = 4;
  if (uVar2 == 0x60) {
    if (value_type == LYD_ANYDATA_DATATREE) goto LAB_0012a8eb;
    if (value_type == LYD_ANYDATA_STRING) {
      if (value == (void *)0x0) {
LAB_0012a8e8:
        value_type = LYD_ANYDATA_DATATREE;
        goto LAB_0012a8eb;
      }
      cVar1 = *value;
      if (cVar1 == '<') {
        value_type = LYD_ANYDATA_XML;
      }
      else if (cVar1 == 'l') {
        if ((*(char *)((long)value + 1) != 'y') ||
           (value_type = LYD_ANYDATA_LYB, *(char *)((long)value + 2) != 'b')) goto LAB_0012a961;
      }
      else if (cVar1 == '{') {
        value_type = LYD_ANYDATA_JSON;
      }
      else {
LAB_0012a961:
        value_type = LYD_ANYDATA_STRING;
      }
    }
    else if (value == (void *)0x0) {
      __assert_fail("value",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                    ,0x152,
                    "LY_ERR lyd_create_any(const struct lysc_node *, const void *, LYD_ANYDATA_VALUETYPE, ly_bool, struct lyd_node **)"
                   );
    }
    LVar4 = ly_in_new_memory((char *)value,&local_50);
    if (LVar4 == LY_SUCCESS) {
      LVar4 = lyd_create_any_datatree(schema->module->ctx,local_50,value_type,'\x01',&local_48);
      if (LVar4 != LY_SUCCESS) {
        ly_log(schema->module->ctx,LY_LLERR,LY_SUCCESS,
               "Failed to parse any content into a data tree.");
        goto LAB_0012a983;
      }
LAB_0012a9cf:
      if (use_value != '\0') {
        free(value);
      }
      value_type = LYD_ANYDATA_DATATREE;
LAB_0012a9e4:
      *(lyd_node **)(trg + 1) = local_48;
      goto LAB_0012a9e8;
    }
LAB_0012a983:
    lyd_free_tree(trg);
  }
  else {
    if (value_type - LYD_ANYDATA_XML < 3) {
      LVar3 = value_type;
      if (value != (void *)0x0) goto LAB_0012a850;
    }
    else if (value_type == LYD_ANYDATA_STRING) {
      if (value == (void *)0x0) goto LAB_0012a8e8;
      cVar1 = *value;
      if (cVar1 != '<') {
        value_type = LYD_ANYDATA_STRING;
        if (cVar1 == 'l') {
          if ((*(char *)((long)value + 1) == 'y') &&
             (LVar3 = LYD_ANYDATA_LYB, *(char *)((long)value + 2) == 'b')) goto LAB_0012a850;
        }
        else if (cVar1 == '{') {
          LVar3 = LYD_ANYDATA_JSON;
          goto LAB_0012a850;
        }
        goto LAB_0012a8eb;
      }
      LVar3 = LYD_ANYDATA_XML;
LAB_0012a850:
      value_type = LVar3;
      LVar4 = ly_in_new_memory((char *)value,&local_50);
      if (LVar4 == LY_SUCCESS) {
        LVar4 = lyd_create_any_datatree(schema->module->ctx,local_50,value_type,'\0',&local_48);
        if (LVar4 != LY_SUCCESS) goto LAB_0012a8eb;
        goto LAB_0012a9cf;
      }
      goto LAB_0012a983;
    }
LAB_0012a8eb:
    if (use_value == '\0') {
      local_38 = (lyd_any_value)value;
      LVar4 = lyd_any_copy_value(trg,&local_38,value_type);
      if (LVar4 != LY_SUCCESS) goto LAB_0012a983;
    }
    else {
      if (value_type - LYD_ANYDATA_STRING < 3) {
        LVar4 = lydict_insert_zc(schema->module->ctx,(char *)value,(char **)(trg + 1));
        if (LVar4 != LY_SUCCESS) goto LAB_0012a983;
      }
      else {
        local_48 = (lyd_node *)value;
        if ((value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_LYB))
        goto LAB_0012a9e4;
      }
LAB_0012a9e8:
      *(LYD_ANYDATA_VALUETYPE *)&trg[1].schema = value_type;
    }
    lyd_hash(trg);
    *local_40 = trg;
    LVar4 = LY_SUCCESS;
  }
  ly_in_free(local_50,'\0');
  return LVar4;
}

Assistant:

LY_ERR
lyd_create_any(const struct lysc_node *schema, const void *value, LYD_ANYDATA_VALUETYPE value_type, ly_bool use_value,
        struct lyd_node **node)
{
    LY_ERR rc = LY_SUCCESS, r;
    struct lyd_node *tree;
    struct lyd_node_any *any = NULL;
    union lyd_any_value any_val;
    struct ly_in *in = NULL;

    assert(schema->nodetype & LYD_NODE_ANY);

    any = calloc(1, sizeof *any);
    LY_CHECK_ERR_RET(!any, LOGMEM(schema->module->ctx), LY_EMEM);

    any->schema = schema;
    any->prev = &any->node;
    any->flags = LYD_NEW;

    if (schema->nodetype == LYS_ANYDATA) {
        /* anydata */
        if (value_type == LYD_ANYDATA_STRING) {
            /* detect value type */
            lyd_create_any_string_valtype(value, &value_type);
        }

        if (value_type != LYD_ANYDATA_DATATREE) {
            /* create input */
            assert(value);
            LY_CHECK_GOTO(rc = ly_in_new_memory(value, &in), cleanup);

            /* parse as a data tree */
            if ((r = lyd_create_any_datatree(schema->module->ctx, in, value_type, 1, &tree))) {
                LOGERR(schema->module->ctx, rc, "Failed to parse any content into a data tree.");
                rc = r;
                goto cleanup;
            }

            /* use the parsed data tree */
            if (use_value) {
                free((void *)value);
            }
            use_value = 1;
            value = tree;
            value_type = LYD_ANYDATA_DATATREE;
        }
    } else {
        /* anyxml */
        switch (value_type) {
        case LYD_ANYDATA_DATATREE:
            /* fine, just use the value */
            break;
        case LYD_ANYDATA_STRING:
            /* detect value type */
            lyd_create_any_string_valtype(value, &value_type);
            if ((value_type == LYD_ANYDATA_DATATREE) || (value_type == LYD_ANYDATA_STRING)) {
                break;
            }
        /* fallthrough */
        case LYD_ANYDATA_XML:
        case LYD_ANYDATA_JSON:
        case LYD_ANYDATA_LYB:
            if (!value) {
                /* nothing to parse */
                break;
            }

            /* create input */
            LY_CHECK_GOTO(rc = ly_in_new_memory(value, &in), cleanup);

            /* try to parse as a data tree */
            r = lyd_create_any_datatree(schema->module->ctx, in, value_type, 0, &tree);
            if (!r) {
                /* use the parsed data tree */
                if (use_value) {
                    free((void *)value);
                }
                use_value = 1;
                value = tree;
                value_type = LYD_ANYDATA_DATATREE;
            }
            break;
        }
    }

    if (use_value) {
        switch (value_type) {
        case LYD_ANYDATA_DATATREE:
            any->value.tree = (void *)value;
            break;
        case LYD_ANYDATA_STRING:
        case LYD_ANYDATA_XML:
        case LYD_ANYDATA_JSON:
            LY_CHECK_GOTO(rc = lydict_insert_zc(schema->module->ctx, (void *)value, &any->value.str), cleanup);
            break;
        case LYD_ANYDATA_LYB:
            any->value.mem = (void *)value;
            break;
        }
        any->value_type = value_type;
    } else {
        any_val.str = value;
        LY_CHECK_GOTO(rc = lyd_any_copy_value(&any->node, &any_val, value_type), cleanup);
    }
    lyd_hash(&any->node);

cleanup:
    if (rc) {
        lyd_free_tree(&any->node);
    } else {
        *node = &any->node;
    }
    ly_in_free(in, 0);
    return rc;
}